

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_concat(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int dim)

{
  ggml_type type;
  long lVar1;
  ulong uVar2;
  ggml_tensor *pgVar3;
  char *pcVar4;
  long lVar5;
  int line;
  int64_t ne [4];
  
  if ((uint)dim < 4) {
    type = a->type;
    if (type == b->type) {
      uVar2 = (ulong)(uint)dim;
      lVar5 = 0;
      do {
        if (lVar5 == 0x20) {
          pgVar3 = ggml_new_tensor(ctx,type,4,ne);
          pgVar3->op_params[0] = dim;
          pgVar3->op = GGML_OP_CONCAT;
          pgVar3->src[0] = a;
          pgVar3->src[1] = b;
          return pgVar3;
        }
        if (uVar2 * 8 - lVar5 == 0) {
          ne[uVar2] = b->ne[uVar2] + a->ne[uVar2];
        }
        else {
          lVar1 = *(long *)((long)a->ne + lVar5);
          if (lVar1 != *(long *)((long)b->ne + lVar5)) {
            pcVar4 = "a->ne[d] == b->ne[d]";
            line = 0x930;
            goto LAB_00120eb6;
          }
          *(long *)((long)ne + lVar5) = lVar1;
        }
        lVar5 = lVar5 + 8;
      } while( true );
    }
    pcVar4 = "a->type == b->type";
    line = 0x928;
  }
  else {
    pcVar4 = "dim >= 0 && dim < GGML_MAX_DIMS";
    line = 0x927;
  }
LAB_00120eb6:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

struct ggml_tensor * ggml_concat(
    struct ggml_context * ctx,
    struct ggml_tensor  * a,
    struct ggml_tensor  * b,
    int                   dim) {
    GGML_ASSERT(dim >= 0 && dim < GGML_MAX_DIMS);
    GGML_ASSERT(a->type == b->type);

    int64_t ne[GGML_MAX_DIMS];
    for (int d = 0; d < GGML_MAX_DIMS; ++d) {
        if (d == dim) {
            ne[d] = a->ne[d] + b->ne[d];
            continue;
        }
        GGML_ASSERT(a->ne[d] == b->ne[d]);
        ne[d] = a->ne[d];
    }

    struct ggml_tensor * result = ggml_new_tensor(ctx, a->type, GGML_MAX_DIMS, ne);

    ggml_set_op_params_i32(result, 0, dim);

    result->op     = GGML_OP_CONCAT;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}